

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ut.hpp
# Opt level: O0

bool boost::ext::ut::v1_1_8::utility::is_match(string_view input,string_view pattern)

{
  char cVar1;
  string_view pattern_00;
  string_view pattern_01;
  string_view pattern_02;
  string_view input_00;
  string_view input_01;
  string_view input_02;
  bool bVar2;
  const_reference pvVar3;
  size_type sVar4;
  char *in_RCX;
  char *in_RDX;
  size_t in_RSI;
  char *in_RDI;
  basic_string_view<char,_std::char_traits<char>_> bVar5;
  size_type i;
  bool local_91;
  undefined1 in_stack_ffffffffffffff70 [16];
  basic_string_view<char,_std::char_traits<char>_> *this;
  undefined1 in_stack_ffffffffffffff80 [16];
  ulong local_50;
  size_t in_stack_ffffffffffffffd0;
  bool local_1;
  
  bVar2 = std::empty<std::basic_string_view<char,std::char_traits<char>>>
                    ((basic_string_view<char,_std::char_traits<char>_> *)0x114d94);
  if (bVar2) {
    local_1 = std::empty<std::basic_string_view<char,std::char_traits<char>>>
                        ((basic_string_view<char,_std::char_traits<char>_> *)0x114da7);
  }
  else {
    bVar2 = std::empty<std::basic_string_view<char,std::char_traits<char>>>
                      ((basic_string_view<char,_std::char_traits<char>_> *)0x114dc2);
    this = in_stack_ffffffffffffff80._0_8_;
    if (bVar2) {
      pvVar3 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                         ((basic_string_view<char,_std::char_traits<char>_> *)
                          &stack0xffffffffffffffd8,0);
      if (*pvVar3 == '*') {
        std::basic_string_view<char,_std::char_traits<char>_>::substr
                  (this,in_stack_ffffffffffffff70._8_8_,in_stack_ffffffffffffff70._0_8_);
        input_00._M_str = in_RDI;
        input_00._M_len = (size_t)in_RCX;
        pattern_00._M_str = in_RDX;
        pattern_00._M_len = in_RSI;
        local_91 = is_match(input_00,pattern_00);
      }
      else {
        local_91 = false;
      }
      local_1 = local_91;
    }
    else {
      pvVar3 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                         ((basic_string_view<char,_std::char_traits<char>_> *)
                          &stack0xffffffffffffffd8,0);
      if ((*pvVar3 != '?') &&
         (pvVar3 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                             ((basic_string_view<char,_std::char_traits<char>_> *)
                              &stack0xffffffffffffffd8,0), *pvVar3 != '*')) {
        pvVar3 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                           ((basic_string_view<char,_std::char_traits<char>_> *)
                            &stack0xffffffffffffffd8,0);
        cVar1 = *pvVar3;
        pvVar3 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                           ((basic_string_view<char,_std::char_traits<char>_> *)
                            &stack0xffffffffffffffe8,0);
        if (cVar1 != *pvVar3) {
          return false;
        }
      }
      pvVar3 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                         ((basic_string_view<char,_std::char_traits<char>_> *)
                          &stack0xffffffffffffffd8,0);
      if (*pvVar3 == '*') {
        for (local_50 = 0;
            sVar4 = std::size<std::basic_string_view<char,std::char_traits<char>>>
                              ((basic_string_view<char,_std::char_traits<char>_> *)0x114f0d),
            local_50 <= sVar4; local_50 = local_50 + 1) {
          std::basic_string_view<char,_std::char_traits<char>_>::substr
                    (in_stack_ffffffffffffff80._0_8_,in_stack_ffffffffffffff70._8_8_,
                     in_stack_ffffffffffffff70._0_8_);
          std::basic_string_view<char,_std::char_traits<char>_>::substr
                    (in_stack_ffffffffffffff80._0_8_,in_stack_ffffffffffffff70._8_8_,
                     in_stack_ffffffffffffff70._0_8_);
          input_01._M_str = in_RDI;
          input_01._M_len = (size_t)in_RCX;
          pattern_01._M_str = in_RDX;
          pattern_01._M_len = in_stack_ffffffffffffffd0;
          bVar2 = is_match(input_01,pattern_01);
          if (bVar2) {
            return true;
          }
        }
        local_1 = false;
      }
      else {
        bVar5 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                          (in_stack_ffffffffffffff80._0_8_,in_stack_ffffffffffffff70._8_8_,
                           in_stack_ffffffffffffff70._0_8_);
        std::basic_string_view<char,_std::char_traits<char>_>::substr
                  ((basic_string_view<char,_std::char_traits<char>_> *)bVar5._M_len,
                   in_stack_ffffffffffffff70._8_8_,in_stack_ffffffffffffff70._0_8_);
        input_02._M_str = in_RDI;
        input_02._M_len = (size_t)in_RCX;
        pattern_02._M_str = in_RDX;
        pattern_02._M_len = in_stack_ffffffffffffffd0;
        local_1 = is_match(input_02,pattern_02);
      }
    }
  }
  return local_1;
}

Assistant:

[[nodiscard]] inline auto is_match(std::string_view input,
                                     std::string_view pattern) -> bool {
    if (std::empty(pattern)) {
      return std::empty(input);
    }

    if (std::empty(input)) {
      return pattern[0] == '*' ? is_match(input, pattern.substr(1)) : false;
    }

    if (pattern[0] != '?' and pattern[0] != '*' and pattern[0] != input[0]) {
      return false;
    }

    if (pattern[0] == '*') {
      for (decltype(std::size(input)) i = 0u; i <= std::size(input); ++i) {
        if (is_match(input.substr(i), pattern.substr(1))) {
          return true;
        }
      }
      return false;
    }

    return is_match(input.substr(1), pattern.substr(1));
  }